

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

int HUF_validateCTable(HUF_CElt *CTable,uint *count,uint maxSymbolValue)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  int local_30;
  int s;
  int bad;
  HUF_CElt *ct;
  uint maxSymbolValue_local;
  uint *count_local;
  HUF_CElt *CTable_local;
  
  bVar2 = 0;
  for (local_30 = 0; local_30 <= (int)maxSymbolValue; local_30 = local_30 + 1) {
    uVar1 = count[local_30];
    sVar3 = HUF_getNbBits(CTable[(long)local_30 + 1]);
    bVar2 = (uVar1 != 0 && sVar3 == 0) | bVar2;
  }
  return (int)((bVar2 ^ 0xff) & 1);
}

Assistant:

int HUF_validateCTable(const HUF_CElt* CTable, const unsigned* count, unsigned maxSymbolValue) {
  HUF_CElt const* ct = CTable + 1;
  int bad = 0;
  int s;
  for (s = 0; s <= (int)maxSymbolValue; ++s) {
    bad |= (count[s] != 0) & (HUF_getNbBits(ct[s]) == 0);
  }
  return !bad;
}